

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureCompletenessTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::Incomplete2DSizeCase::createTexture(Incomplete2DSizeCase *this)

{
  ostringstream *this_00;
  uint uVar1;
  int height;
  TextureFormat TVar2;
  char *extension;
  bool bVar3;
  uint uVar4;
  GLenum err;
  long lVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  int level;
  int width;
  int height_00;
  int width_00;
  GLuint texture;
  TextureFormat local_200;
  Vec4 local_1f8;
  TextureFormat fmt;
  TextureLevel levelData;
  undefined1 local_1b0 [32];
  void *local_190;
  ios_base local_138 [264];
  
  fmt = glu::mapGLTransferFormat(0x1908,0x1401);
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  TVar2 = (TextureFormat)((this->super_Tex2DCompletenessCase).m_testCtx)->m_log;
  glwGenTextures(1,&texture);
  glwPixelStorei(0xcf5,1);
  glwBindTexture(0xde1,texture);
  glwTexParameteri(0xde1,0x2802,0x2901);
  glwTexParameteri(0xde1,0x2803,0x2901);
  glwTexParameteri(0xde1,0x2801,0x2700);
  glwTexParameteri(0xde1,0x2800,0x2600);
  uVar1 = (this->m_size).m_data[0];
  uVar4 = 0x20;
  uVar7 = 0x20;
  if (uVar1 != 0) {
    uVar7 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = uVar7 ^ 0x1f;
  }
  uVar1 = (this->m_size).m_data[1];
  if (uVar1 != 0) {
    uVar4 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x1f;
  }
  iVar8 = 0x1f - uVar4;
  if ((int)(0x1f - uVar4) < (int)(0x1f - uVar7)) {
    iVar8 = 0x1f - uVar7;
  }
  local_200 = TVar2;
  if (-1 < iVar8) {
    level = 0;
    do {
      height = (this->m_size).m_data[1];
      if (level == *(int *)&(this->super_Tex2DCompletenessCase).field_0x84) {
        width_00 = (this->m_invalidLevelSize).m_data[0];
        height_00 = (this->m_invalidLevelSize).m_data[1];
        width = (this->m_size).m_data[0];
      }
      else {
        width = (this->m_size).m_data[0];
        width_00 = width >> ((byte)level & 0x1f);
        if (width_00 < 2) {
          width_00 = 1;
        }
        height_00 = height >> ((byte)level & 0x1f);
        if (height_00 < 2) {
          height_00 = 1;
        }
      }
      tcu::TextureLevel::setSize(&levelData,width,height,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&levelData);
      local_1f8.m_data[0] = 0.0;
      local_1f8.m_data[1] = 0.0;
      local_1f8.m_data[2] = 1.0;
      local_1f8.m_data[3] = 1.0;
      tcu::clear((PixelBufferAccess *)local_1b0,&local_1f8);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b0,&levelData);
      glwTexImage2D(0xde1,level,0x1908,width_00,height_00,0,0x1908,0x1401,local_190);
      level = level + 1;
    } while (iVar8 + 1 != level);
  }
  err = glwGetError();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureCompletenessTests.cpp"
                  ,0x127);
  uVar1 = (this->m_size).m_data[0];
  if (((uVar1 & uVar1 - 1) != 0) && (uVar1 = (this->m_size).m_data[1], (uVar1 & uVar1 - 1) != 0)) {
    lVar5 = 0;
    bVar3 = true;
    do {
      bVar9 = bVar3;
      extension = createTexture::s_relaxingExtensions[lVar5];
      bVar3 = isExtensionSupported(this->m_ctxInfo,extension);
      if (bVar3) {
        this_00 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_4_ = local_200.order;
        local_1b0._4_4_ = local_200.type;
        std::__cxx11::ostringstream::ostringstream(this_00);
        sVar6 = strlen(extension);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,extension,sVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," supported, assuming completeness test to pass.",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        (this->super_Tex2DCompletenessCase).m_compareColor.m_value = 0xffff0000;
        break;
      }
      lVar5 = 1;
      bVar3 = false;
    } while (bVar9);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void Incomplete2DSizeCase::createTexture (void)
{
	static const char* const s_relaxingExtensions[] =
	{
		"GL_OES_texture_npot",
		"GL_NV_texture_npot_2D_mipmap",
	};

	tcu::TextureFormat		fmt				= glu::mapGLTransferFormat(GL_RGBA, GL_UNSIGNED_BYTE);
	tcu::TextureLevel		levelData		(fmt);
	TestLog&				log				= m_testCtx.getLog();

	GLuint texture;
	glGenTextures	(1, &texture);
	glPixelStorei	(GL_UNPACK_ALIGNMENT, 1);
	glBindTexture	(GL_TEXTURE_2D, texture);

	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST_MIPMAP_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	int numLevels = 1 + de::max(deLog2Floor32(m_size.x()), deLog2Floor32(m_size.y()));

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int	levelW = (levelNdx == m_invalidLevelNdx) ? m_invalidLevelSize.x() : de::max(1, m_size.x() >> levelNdx);
		int	levelH = (levelNdx == m_invalidLevelNdx) ? m_invalidLevelSize.y() : de::max(1, m_size.y() >> levelNdx);

		levelData.setSize(m_size.x(), m_size.y());
		clear(levelData.getAccess(), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

		glTexImage2D(GL_TEXTURE_2D, levelNdx, GL_RGBA, levelW, levelH, 0, GL_RGBA, GL_UNSIGNED_BYTE, levelData.getAccess().getDataPtr());
	}

	GLU_CHECK_MSG("Set texturing state");

	// If size not allowed in core, search for relaxing extensions
	if (!deIsPowerOfTwo32(m_size.x()) && !deIsPowerOfTwo32(m_size.y()))
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_relaxingExtensions); ++ndx)
		{
			if (isExtensionSupported(m_ctxInfo, s_relaxingExtensions[ndx]))
			{
				log << TestLog::Message << s_relaxingExtensions[ndx] << " supported, assuming completeness test to pass." << TestLog::EndMessage;
				m_compareColor = RGBA(0,0,255,255);
				break;
			}
		}
	}
}